

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddDrawListToRenderList(ImVector<ImDrawList_*> *out_render_list,ImDrawList *draw_list)

{
  int *piVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  value_type *pvVar4;
  long lVar5;
  ImDrawList *local_18;
  
  if ((draw_list->CmdBuffer).Size != 0) {
    local_18 = draw_list;
    pvVar4 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer);
    if (((pvVar4->ElemCount == 0) && (pvVar4->UserCallback == (ImDrawCallback)0x0)) &&
       (ImVector<ImDrawCmd>::pop_back(&draw_list->CmdBuffer), (draw_list->CmdBuffer).Size == 0)) {
      return;
    }
    uVar2 = (draw_list->VtxBuffer).Size;
    if (((long)(int)uVar2 != 0) &&
       (draw_list->_VtxWritePtr != (draw_list->VtxBuffer).Data + (int)uVar2)) {
      __assert_fail("draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                    ,0xa2d,"void AddDrawListToRenderList(ImVector<ImDrawList *> &, ImDrawList *)");
    }
    lVar5 = (long)(draw_list->IdxBuffer).Size;
    if ((lVar5 != 0) && (draw_list->_IdxWritePtr != (draw_list->IdxBuffer).Data + lVar5)) {
      __assert_fail("draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                    ,0xa2e,"void AddDrawListToRenderList(ImVector<ImDrawList *> &, ImDrawList *)");
    }
    if (draw_list->_VtxCurrentIdx != uVar2) {
      __assert_fail("(int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                    ,0xa2f,"void AddDrawListToRenderList(ImVector<ImDrawList *> &, ImDrawList *)");
    }
    if (0xffff < uVar2) {
      __assert_fail("((ImU64)draw_list->_VtxCurrentIdx >> (sizeof(ImDrawIdx)*8)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                    ,0xa38,"void AddDrawListToRenderList(ImVector<ImDrawList *> &, ImDrawList *)");
    }
    ImVector<ImDrawList_*>::push_back(out_render_list,&local_18);
    pIVar3 = GImGui;
    piVar1 = &(GImGui->IO).MetricsRenderVertices;
    *piVar1 = *piVar1 + (local_18->VtxBuffer).Size;
    piVar1 = &(pIVar3->IO).MetricsRenderIndices;
    *piVar1 = *piVar1 + (local_18->IdxBuffer).Size;
  }
  return;
}

Assistant:

static void AddDrawListToRenderList(ImVector<ImDrawList*>& out_render_list, ImDrawList* draw_list)
{
    if (draw_list->CmdBuffer.empty())
        return;

    // Remove trailing command if unused
    ImDrawCmd& last_cmd = draw_list->CmdBuffer.back();
    if (last_cmd.ElemCount == 0 && last_cmd.UserCallback == NULL)
    {
        draw_list->CmdBuffer.pop_back();
        if (draw_list->CmdBuffer.empty())
            return;
    }

    // Draw list sanity check. Detect mismatch between PrimReserve() calls and incrementing _VtxCurrentIdx, _VtxWritePtr etc. May trigger for you if you are using PrimXXX functions incorrectly.
    IM_ASSERT(draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size);
    IM_ASSERT(draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size);
    IM_ASSERT((int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size);

    // Check that draw_list doesn't use more vertices than indexable in a single draw call (default ImDrawIdx = unsigned short = 2 bytes = 64K vertices per window)
    // If this assert triggers because you are drawing lots of stuff manually, you can:
    // A) Add '#define ImDrawIdx unsigned int' in imconfig.h to set the index size to 4 bytes. You'll need to handle the 4-bytes indices to your renderer.
    //    For example, the OpenGL example code detect index size at compile-time by doing:
    //    'glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer_offset);'
    //    Your own engine or render API may use different parameters or function calls to specify index sizes. 2 and 4 bytes indices are generally supported by most API.
    // B) If for some reason you cannot use 4 bytes indices or don't want to, a workaround is to call BeginChild()/EndChild() before reaching the 64K limit to split your draw commands in multiple draw lists.
    IM_ASSERT(((ImU64)draw_list->_VtxCurrentIdx >> (sizeof(ImDrawIdx)*8)) == 0);  // Too many vertices in same ImDrawList. See comment above.
    
    out_render_list.push_back(draw_list);
    GImGui->IO.MetricsRenderVertices += draw_list->VtxBuffer.Size;
    GImGui->IO.MetricsRenderIndices += draw_list->IdxBuffer.Size;
}